

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcp_dial_start_next(tcp_dialer *d)

{
  int iVar1;
  
  iVar1 = nni_list_empty(&d->conaios);
  if (iVar1 != 0) {
    return;
  }
  (d->resolv).ri_family = 0;
  (d->resolv).ri_passive = false;
  *(undefined3 *)&(d->resolv).field_0x5 = 0;
  (d->resolv).ri_host = (char *)0x0;
  *(undefined8 *)&(d->resolv).ri_port = 0;
  (d->resolv).ri_sa = (nng_sockaddr *)0x0;
  (d->resolv).ri_family = d->af;
  (d->resolv).ri_passive = false;
  (d->resolv).ri_host = d->host;
  (d->resolv).ri_port = d->port;
  (d->resolv).ri_sa = &d->sa;
  nni_resolv(&d->resolv,&d->resaio);
  return;
}

Assistant:

static void
tcp_dial_start_next(tcp_dialer *d)
{
	if (nni_list_empty(&d->conaios)) {
		return;
	}
	memset(&d->resolv, 0, sizeof(d->resolv));
	d->resolv.ri_family  = d->af;
	d->resolv.ri_passive = false;
	d->resolv.ri_host    = d->host;
	d->resolv.ri_port    = d->port;
	d->resolv.ri_sa      = &d->sa;

	nni_resolv(&d->resolv, &d->resaio);
}